

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O3

void __thiscall
testing::
Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
Matcher(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *this,string *s)

{
  pointer pcVar1;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  long *local_58;
  long local_50;
  long local_48 [2];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_38;
  
  (this->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).vtable_ = (VTable *)0x0;
  (this->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).buffer_.ptr = (void *)0x0;
  (this->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0016b708;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar1,pcVar1 + s->_M_string_length)
  ;
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_58,local_50 + (long)local_58);
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0016b980;
  local_38.buffer_.ptr = (void *)0x0;
  local_38.vtable_ =
       (VTable *)
       internal::MatcherBase<std::__cxx11::string_const&>::
       GetVTable<testing::internal::MatcherBase<std::__cxx11::string_const&>::ValuePolicy<testing::internal::EqMatcher<std::__cxx11::string>,false>>()
       ::kVTable_abi_cxx11_;
  local_38.buffer_.ptr = operator_new(0x28);
  ((local_38.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_38.buffer_.i + 8) = (undefined8 *)(local_38.buffer_.i + 0x18);
  if (local_78 == &local_68) {
    *(undefined8 *)(local_38.buffer_.i + 0x18) = CONCAT71(uStack_67,local_68);
    *(undefined8 *)(local_38.buffer_.i + 0x20) = uStack_60;
  }
  else {
    *(undefined1 **)(local_38.buffer_.i + 8) = local_78;
    *(ulong *)(local_38.buffer_.i + 0x18) = CONCAT71(uStack_67,local_68);
  }
  *(undefined8 *)(local_38.buffer_.i + 0x10) = local_70;
  local_70 = 0;
  local_68 = 0;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0016b708;
  local_78 = &local_68;
  internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::operator=(&this->
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ,&local_38);
  internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_38);
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

Matcher<const std::string&>::Matcher(const std::string& s) { *this = Eq(s); }